

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O2

void loadlc(int offset,int pos)

{
  ulong uVar1;
  long lStack_10;
  
  if (pos == 0) {
    if (bank < 0xf0) {
      hexcon(2,bank,prlnbuf + 7);
      lStack_10 = 7;
    }
    else {
      prlnbuf[7] = '-';
      prlnbuf[8] = '-';
      lStack_10 = 9;
    }
    uVar1 = (ulong)((int)lStack_10 + 1);
    prlnbuf[lStack_10] = ':';
    offset = offset + page * 0x2000;
  }
  else {
    uVar1 = 0x10;
  }
  hexcon(4,offset,prlnbuf + uVar1);
  return;
}

Assistant:

void
loadlc(int offset, int pos)
{
	int	i;

	if (pos)
		i = 16;
	else
		i = 7;

	if (pos == 0) {
		if (bank >= RESERVED_BANK) {
			prlnbuf[i++] = '-';
			prlnbuf[i++] = '-';
		}
		else {
			hexcon(2, bank, &prlnbuf[i]);
		}
		prlnbuf[i++] = ':';
		offset += page << 13;
	}
	hexcon(4, offset, &prlnbuf[i]);
}